

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_rep_timespec.cc
# Opt level: O1

nsync_time __thiscall nsync::nsync_time_sleep(nsync *this,nsync_time delay)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  int64_t ns;
  long lVar4;
  ulong uVar5;
  long lVar6;
  nsync *pnVar7;
  long lVar8;
  nsync_time nVar9;
  timespec local_38;
  
  lVar6 = delay.tv_sec;
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar4 = lVar2 + lVar6 + (lVar2 / 1000000000) * -1000000000;
  lVar8 = lVar4 + -1000000000;
  if (lVar4 < 1000000000) {
    lVar8 = lVar4;
  }
  pnVar7 = this + (ulong)(999999999 < lVar4) + lVar2 / 1000000000;
  uVar5 = (long)this * 1000000000 + lVar6;
  if (uVar5 != 0 && SCARRY8((long)this * 1000000000,lVar6) == (long)uVar5 < 0) {
    local_38.tv_sec = uVar5 / 1000000000;
    local_38.tv_nsec = uVar5 % 1000000000;
    do {
      iVar1 = nanosleep(&local_38,&local_38);
      if (iVar1 != -1) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
  }
  lVar4 = std::chrono::_V2::system_clock::now();
  lVar2 = lVar4 / 1000000000;
  lVar4 = lVar4 % 1000000000;
  iVar1 = (uint)((long)pnVar7 < lVar2) - (uint)((long)pnVar7 - lVar2 != 0 && lVar2 <= (long)pnVar7);
  if (iVar1 == 0) {
    iVar1 = (uint)(lVar8 < lVar4) - (uint)(lVar4 < lVar8);
  }
  if (iVar1 < 0) {
    lVar6 = lVar8 + 1000000000;
    if (lVar4 <= lVar8) {
      lVar6 = lVar8;
    }
    lVar8 = ((long)pnVar7 - lVar2) - (ulong)(lVar8 < lVar4);
    lVar6 = lVar6 - lVar4;
  }
  else {
    lVar8 = 0;
    lVar6 = 0;
  }
  nVar9.tv_nsec = lVar6;
  nVar9.tv_sec = lVar8;
  return nVar9;
}

Assistant:

nsync_time nsync_time_sleep (nsync_time delay) {
	nsync_time start = nsync_time_now ();
	nsync_time expected_end = nsync_time_add (start, delay);
	nsync_time remain;
	std::chrono::nanoseconds delay_ns(NSYNC_TIME_NSEC (delay) +
					  NSYNC_NS_IN_S_ * (int64_t) NSYNC_TIME_SEC (delay));
	std::this_thread::sleep_for (delay_ns);
	nsync_time actual_end = nsync_time_now ();
	if (nsync_time_cmp (actual_end, expected_end) < 0) {
		remain = nsync_time_sub (expected_end, actual_end);
	} else {
		remain = nsync_time_zero;
	}
	return (remain);
}